

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

deUint32 __thiscall
sglr::ReferenceContext::blitResolveMultisampleFramebuffer
          (ReferenceContext *this,deUint32 mask,IVec4 *srcRect,IVec4 *dstRect,bool flipX,bool flipY)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  TextureChannelClass TVar4;
  uint uVar5;
  int y;
  int iVar6;
  int x;
  uint uVar7;
  ConstPixelBufferAccess srcRaw;
  PixelBufferAccess dst;
  MultisampleConstPixelBufferAccess src;
  ConstPixelBufferAccess local_68;
  TextureFormat local_40;
  TextureFormat srcFmt;
  
  if ((mask >> 0xe & 1) != 0) {
    getReadColorbuffer((MultisamplePixelBufferAccess *)&srcRaw,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&srcRaw,
                     srcRect->m_data[0],srcRect->m_data[1],srcRect->m_data[2],srcRect->m_data[3]);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src,(MultisamplePixelBufferAccess *)&dst);
    getDrawColorbuffer((MultisamplePixelBufferAccess *)&local_68,this);
    rr::MultisamplePixelBufferAccess::toSinglesampleAccess
              ((PixelBufferAccess *)&srcRaw,(MultisamplePixelBufferAccess *)&local_68);
    tcu::getSubregion(&dst,(PixelBufferAccess *)&srcRaw,dstRect->m_data[0],dstRect->m_data[1],
                      dstRect->m_data[2],dstRect->m_data[3]);
    TVar4 = tcu::getTextureChannelClass(dst.super_ConstPixelBufferAccess.m_format.type);
    bVar1 = tcu::isSRGB(src.m_access.m_format);
    bVar2 = tcu::isSRGB(dst.super_ConstPixelBufferAccess.m_format);
    if ((this->m_sRGBUpdateEnabled == true) &&
       (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0)) {
      bVar3 = 1;
    }
    else {
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&srcRaw,&src.m_access);
      srcFmt = toNonSRGBFormat(&srcRaw.m_format);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_68,&srcFmt,srcRaw.m_size.m_data[0],srcRaw.m_size.m_data[1],
                 srcRaw.m_size.m_data[2],srcRaw.m_pitch.m_data[1],srcRaw.m_pitch.m_data[2],
                 srcRaw.m_data);
      srcRaw.m_data = local_68.m_data;
      srcRaw.m_size.m_data[2] = local_68.m_size.m_data[2];
      srcRaw.m_pitch.m_data[0] = local_68.m_pitch.m_data[0];
      srcRaw.m_pitch.m_data[1] = local_68.m_pitch.m_data[1];
      srcRaw.m_pitch.m_data[2] = local_68.m_pitch.m_data[2];
      srcRaw.m_format = local_68.m_format;
      srcRaw.m_size.m_data[0] = local_68.m_size.m_data[0];
      srcRaw.m_size.m_data[1] = local_68.m_size.m_data[1];
      rr::MultisampleConstPixelBufferAccess::fromMultisampleAccess
                ((MultisampleConstPixelBufferAccess *)&local_68,&srcRaw);
      src.m_access.m_data = local_68.m_data;
      src.m_access.m_size.m_data[2] = local_68.m_size.m_data[2];
      src.m_access.m_pitch.m_data[0] = local_68.m_pitch.m_data[0];
      src.m_access.m_pitch.m_data[1] = local_68.m_pitch.m_data[1];
      src.m_access.m_pitch.m_data[2] = local_68.m_pitch.m_data[2];
      src.m_access.m_format = local_68.m_format;
      src.m_access.m_size.m_data[0] = local_68.m_size.m_data[0];
      src.m_access.m_size.m_data[1] = local_68.m_size.m_data[1];
      local_40 = toNonSRGBFormat((TextureFormat *)&dst);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_68,&local_40,
                 dst.super_ConstPixelBufferAccess.m_size.m_data[0],
                 dst.super_ConstPixelBufferAccess.m_size.m_data[1],
                 dst.super_ConstPixelBufferAccess.m_size.m_data[2],
                 dst.super_ConstPixelBufferAccess.m_pitch.m_data[1],
                 dst.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                 dst.super_ConstPixelBufferAccess.m_data);
      dst.super_ConstPixelBufferAccess.m_data = local_68.m_data;
      dst.super_ConstPixelBufferAccess.m_size.m_data[2] = local_68.m_size.m_data[2];
      dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] = local_68.m_pitch.m_data[0];
      dst.super_ConstPixelBufferAccess.m_pitch.m_data[1] = local_68.m_pitch.m_data[1];
      dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] = local_68.m_pitch.m_data[2];
      dst.super_ConstPixelBufferAccess.m_format = local_68.m_format;
      dst.super_ConstPixelBufferAccess.m_size.m_data[0] = local_68.m_size.m_data[0];
      dst.super_ConstPixelBufferAccess.m_size.m_data[1] = local_68.m_size.m_data[1];
      bVar3 = 0;
    }
    for (uVar7 = 0; (int)uVar7 < dstRect->m_data[2]; uVar7 = uVar7 + 1) {
      for (iVar6 = 0; iVar6 < dstRect->m_data[3]; iVar6 = iVar6 + 1) {
        uVar5 = srcRect->m_data[2] + ~uVar7;
        if (!flipX) {
          uVar5 = uVar7;
        }
        if ((0x13U >> ((byte)TVar4 & 0x1f) & TVar4 < TEXTURECHANNELCLASS_LAST) == 0 && !bVar1) {
          tcu::ConstPixelBufferAccess::getPixelInt(&srcRaw,(int)&src,0,uVar5);
          tcu::PixelBufferAccess::setPixel(&dst,(IVec4 *)&srcRaw,uVar7,iVar6,0);
        }
        else {
          tcu::ConstPixelBufferAccess::getPixel(&srcRaw,(int)&src,0,uVar5);
          if ((bVar2 & bVar3) == 0) {
            tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_68,(Vector<float,_4> *)&srcRaw)
            ;
          }
          else {
            tcu::linearToSRGB((tcu *)&local_68,(Vec4 *)&srcRaw);
          }
          tcu::PixelBufferAccess::setPixel(&dst,(Vec4 *)&local_68,uVar7,iVar6,0);
        }
      }
    }
  }
  if ((mask >> 8 & 1) != 0) {
    getReadDepthbuffer((MultisamplePixelBufferAccess *)&srcRaw,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&srcRaw,
                     srcRect->m_data[0],srcRect->m_data[1],srcRect->m_data[2],srcRect->m_data[3]);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src,(MultisamplePixelBufferAccess *)&dst);
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)&srcRaw,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&srcRaw,
                     dstRect->m_data[0],dstRect->m_data[1],dstRect->m_data[2],dstRect->m_data[3]);
    for (uVar7 = 0; (int)uVar7 < dstRect->m_data[2]; uVar7 = uVar7 + 1) {
      for (iVar6 = 0; iVar6 < dstRect->m_data[3]; iVar6 = iVar6 + 1) {
        uVar5 = srcRect->m_data[2] + ~uVar7;
        if (!flipX) {
          uVar5 = uVar7;
        }
        tcu::ConstPixelBufferAccess::getPixel(&srcRaw,(int)&src,0,uVar5);
        tcu::PixelBufferAccess::setPixDepth(&dst,(float)srcRaw.m_format.order,0,uVar7,iVar6);
      }
    }
  }
  if ((mask >> 10 & 1) != 0) {
    getReadStencilbuffer((MultisamplePixelBufferAccess *)&local_68,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&srcRaw,
                     (MultisamplePixelBufferAccess *)&local_68,srcRect->m_data[0],srcRect->m_data[1]
                     ,srcRect->m_data[2],srcRect->m_data[3]);
    getStencilMultisampleAccess
              ((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&srcRaw);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src,(MultisamplePixelBufferAccess *)&dst);
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)&local_68,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&srcRaw,
                     (MultisamplePixelBufferAccess *)&local_68,dstRect->m_data[0],dstRect->m_data[1]
                     ,dstRect->m_data[2],dstRect->m_data[3]);
    getStencilMultisampleAccess
              ((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&srcRaw);
    for (uVar7 = 0; (int)uVar7 < dstRect->m_data[2]; uVar7 = uVar7 + 1) {
      for (iVar6 = 0; iVar6 < dstRect->m_data[3]; iVar6 = iVar6 + 1) {
        uVar5 = srcRect->m_data[2] + ~uVar7;
        if (!flipX) {
          uVar5 = uVar7;
        }
        tcu::ConstPixelBufferAccess::getPixelUint(&srcRaw,(int)&src,0,uVar5);
        writeMaskedStencil((MultisamplePixelBufferAccess *)&dst,0,uVar7,iVar6,srcRaw.m_format.order,
                           this->m_stencil[0].writeMask);
      }
    }
  }
  return 0;
}

Assistant:

deUint32 ReferenceContext::blitResolveMultisampleFramebuffer (deUint32 mask, const IVec4& srcRect, const IVec4& dstRect, bool flipX, bool flipY)
{
	if (mask & GL_COLOR_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src			= rr::getSubregion(getReadColorbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		tcu::PixelBufferAccess					dst			= tcu::getSubregion(getDrawColorbuffer().toSinglesampleAccess(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());
		tcu::TextureChannelClass				dstClass	= tcu::getTextureChannelClass(dst.getFormat().type);
		bool									dstIsFloat	= dstClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT		||
															  dstClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
															  dstClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		bool									srcIsSRGB	= tcu::isSRGB(src.raw().getFormat());
		bool									dstIsSRGB	= tcu::isSRGB(dst.getFormat());
		const bool								convertSRGB	= m_sRGBUpdateEnabled && glu::isContextTypeES(getType());

		if (!convertSRGB)
		{
			tcu::ConstPixelBufferAccess	srcRaw	= src.raw();
			tcu::TextureFormat			srcFmt	= toNonSRGBFormat(srcRaw.getFormat());

			srcRaw	= tcu::ConstPixelBufferAccess(srcFmt, srcRaw.getWidth(), srcRaw.getHeight(), srcRaw.getDepth(), srcRaw.getRowPitch(), srcRaw.getSlicePitch(), srcRaw.getDataPtr());
			src		= rr::MultisampleConstPixelBufferAccess::fromMultisampleAccess(srcRaw);

			dst		= tcu::PixelBufferAccess(toNonSRGBFormat(dst.getFormat()), dst.getWidth(), dst.getHeight(), dst.getDepth(), dst.getRowPitch(), dst.getSlicePitch(), dst.getDataPtr());
		}

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int srcX = (flipX) ? (srcRect.z() - x - 1) : (x);
			int srcY = (flipY) ? (srcRect.z() - y - 1) : (y);

			if (dstIsFloat || srcIsSRGB)
			{
				Vec4 p = src.raw().getPixel(0, srcX,srcY);
				dst.setPixel((dstIsSRGB && convertSRGB) ? tcu::linearToSRGB(p) : p, x, y);
			}
			else
				dst.setPixel(src.raw().getPixelInt(0, srcX, srcY), x, y);
		}
	}

	if (mask & GL_DEPTH_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= rr::getSubregion(getReadDepthbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		rr::MultisamplePixelBufferAccess		dst	= rr::getSubregion(getDrawDepthbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int srcX = (flipX) ? (srcRect.z() - x - 1) : (x);
			int srcY = (flipY) ? (srcRect.z() - y - 1) : (y);

			writeDepthOnly(dst, 0, x, y, src.raw().getPixel(0, srcX, srcY).x());
		}
	}

	if (mask & GL_STENCIL_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= getStencilMultisampleAccess(rr::getSubregion(getReadStencilbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst	= getStencilMultisampleAccess(rr::getSubregion(getDrawStencilbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int			srcX		= (flipX) ? (srcRect.z() - x - 1) : (x);
			int			srcY		= (flipY) ? (srcRect.z() - y - 1) : (y);
			deUint32	srcStencil	= src.raw().getPixelUint(0, srcX, srcY).x();

			writeMaskedStencil(dst, 0, x, y, srcStencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
	}

	return GL_NO_ERROR;
}